

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O0

void example1(char *filename,char *file_Y,char *file_Cb,char *file_Cr,char *file_rgb_recov)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  BITMAPINFOHEADER bmInfo;
  BITMAPINFOHEADER bmInfo_00;
  BITMAPINFOHEADER bmInfo_01;
  BITMAPINFOHEADER bmInfo_02;
  BITMAPINFOHEADER bmInfo_03;
  BITMAPINFOHEADER bmInfo_04;
  BITMAPINFOHEADER bmInfo_05;
  BITMAPINFOHEADER bmInfo_06;
  BITMAPINFOHEADER bmInfo_07;
  BITMAPINFOHEADER bmInfo_08;
  BITMAPINFOHEADER bmInfo_09;
  BITMAPINFOHEADER bmInfo_10;
  BITMAPFILEHEADER bmFile;
  BITMAPFILEHEADER bmFile_00;
  BITMAPFILEHEADER bmFile_01;
  BITMAPFILEHEADER bmFile_02;
  BITMAPFILEHEADER bmFile_03;
  BITMAPFILEHEADER bmFile_04;
  BITMAPFILEHEADER bmFile_05;
  BITMAPFILEHEADER bmFile_06;
  BITMAPFILEHEADER bmFile_07;
  BITMAPFILEHEADER bmFile_08;
  BITMAPFILEHEADER bmFile_09;
  BITMAPFILEHEADER bmFile_10;
  TRIPLERGB **ppTVar7;
  undefined8 uVar8;
  ostream *poVar9;
  int *piVar10;
  int local_39c;
  int i;
  double entropyCr;
  double entropyCb;
  double entropyY;
  double entropyBlue;
  double entropyGreen;
  double entropyRed;
  int *freq;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  uint local_338;
  uint uStack_334;
  BITMAPFILEHEADER local_330;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  uint local_300;
  uint uStack_2fc;
  BITMAPFILEHEADER local_2f8;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  uint local_2c8;
  uint uStack_2c4;
  BITMAPFILEHEADER local_2c0;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  uint local_290;
  uint uStack_28c;
  BITMAPFILEHEADER local_288;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  uint local_258;
  uint uStack_254;
  BITMAPFILEHEADER local_250;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  uint local_220;
  uint uStack_21c;
  BITMAPFILEHEADER local_218;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  uint local_1e8;
  uint uStack_1e4;
  BITMAPFILEHEADER local_1e0;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  uint local_1b0;
  uint uStack_1ac;
  undefined1 local_1a8 [16];
  double PSNR_RGB_RGBr_blue;
  double PSNR_RGB_RGBr_green;
  double PSNR_RGB_RGBr_red;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  uint local_160;
  uint uStack_15c;
  undefined1 local_158 [16];
  TRIPLERGB **mrxRGBconv;
  TRIPLERGB **mrxCr;
  TRIPLERGB **mrxCb;
  TRIPLERGB **mrxY;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  uint local_108;
  uint uStack_104;
  BITMAPFILEHEADER local_100;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  uint local_d0;
  uint uStack_cc;
  undefined1 local_c8 [16];
  TRIPLERGB **mrxYCbCr;
  size_t defWidth;
  size_t defHeight;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  uint local_80;
  uint uStack_7c;
  undefined1 local_78 [16];
  TRIPLERGB **mrxRGB;
  BITMAPINFOHEADER bmInfoDef;
  BITMAPFILEHEADER bmFileDef;
  char *file_rgb_recov_local;
  char *file_Cr_local;
  char *file_Cb_local;
  char *file_Y_local;
  char *filename_local;
  
  std::operator<<((ostream *)&std::cout,"reading file...\n");
  system("mkdir -p images");
  system("mkdir -p histograms");
  local_78._8_8_ =
       loadBMPFile((BITMAPFILEHEADER *)&bmInfoDef.biClrUsed,(BITMAPINFOHEADER *)&mrxRGB,filename);
  std::operator<<((ostream *)&std::cout,"-------------------------------------\n");
  local_80 = bmInfoDef.biClrUsed;
  uStack_7c = bmInfoDef.biClrImportant;
  local_78._0_8_ = bmFileDef._0_8_;
  memcpy(&defHeight,&mrxRGB,0x28);
  bmFile_10.bfReserved1 = local_78._0_2_;
  bmFile_10.bfReserved2 = local_78._2_2_;
  bmFile_10.bfOffBits = local_78._4_4_;
  bmFile_10._0_8_ = _local_80;
  bmInfo.biHeight = (undefined4)uStack_a0;
  bmInfo.biPlanes = uStack_a0._4_2_;
  bmInfo.biBitCount = uStack_a0._6_2_;
  bmInfo.biSize = (undefined4)defHeight;
  bmInfo.biWidth = defHeight._4_4_;
  bmInfo.biCompression = (undefined4)local_98;
  bmInfo.biSizeImage = local_98._4_4_;
  bmInfo.biXPelsPerMeter = (undefined4)uStack_90;
  bmInfo.biYPelsPerMeter = uStack_90._4_4_;
  bmInfo.biClrUsed = (undefined4)local_88;
  bmInfo.biClrImportant = local_88._4_4_;
  printHeader(bmFile_10,bmInfo);
  std::operator<<((ostream *)&std::cout,"-------------------------------------\n");
  defWidth = (size_t)bmInfoDef.biSize;
  mrxYCbCr = (TRIPLERGB **)(ulong)mrxRGB._4_4_;
  local_c8._8_8_ = RGB2YCbCr((TRIPLERGB **)local_78._8_8_,defWidth,(size_t)mrxYCbCr);
  uVar8 = local_78._8_8_;
  local_d0 = bmInfoDef.biClrUsed;
  uStack_cc = bmInfoDef.biClrImportant;
  local_c8._0_8_ = bmFileDef._0_8_;
  memcpy(&local_100.bfReserved1,&mrxRGB,0x28);
  bmFile_09.bfReserved1 = local_c8._0_2_;
  bmFile_09.bfReserved2 = local_c8._2_2_;
  bmFile_09.bfOffBits = local_c8._4_4_;
  bmFile_09._0_8_ = _local_d0;
  bmInfo_00.biHeight = (undefined4)uStack_f0;
  bmInfo_00.biPlanes = uStack_f0._4_2_;
  bmInfo_00.biBitCount = uStack_f0._6_2_;
  bmInfo_00._0_8_ = local_100._8_8_;
  bmInfo_00.biCompression = (undefined4)local_e8;
  bmInfo_00.biSizeImage = local_e8._4_4_;
  bmInfo_00.biXPelsPerMeter = (undefined4)uStack_e0;
  bmInfo_00.biYPelsPerMeter = uStack_e0._4_4_;
  bmInfo_00.biClrUsed = (undefined4)local_d8;
  bmInfo_00.biClrImportant = local_d8._4_4_;
  save_components_to_files
            ((TRIPLERGB **)uVar8,bmFile_09,bmInfo_00,0,"file_Red.bmp","file_Green.bmp",
             "file_Blue.bmp");
  uVar8 = local_c8._8_8_;
  local_108 = bmInfoDef.biClrUsed;
  uStack_104 = bmInfoDef.biClrImportant;
  local_100._0_8_ = bmFileDef._0_8_;
  memcpy(&mrxY,&mrxRGB,0x28);
  bmFile_08.bfReserved1 = local_100.bfType;
  bmFile_08.bfReserved2 = local_100._2_2_;
  bmFile_08.bfOffBits = local_100.bfSize;
  bmFile_08._0_8_ = _local_108;
  bmInfo_01.biHeight = (undefined4)uStack_128;
  bmInfo_01.biPlanes = uStack_128._4_2_;
  bmInfo_01.biBitCount = uStack_128._6_2_;
  bmInfo_01._0_8_ = mrxY;
  bmInfo_01.biCompression = (undefined4)local_120;
  bmInfo_01.biSizeImage = local_120._4_4_;
  bmInfo_01.biXPelsPerMeter = (undefined4)uStack_118;
  bmInfo_01.biYPelsPerMeter = uStack_118._4_4_;
  bmInfo_01.biClrUsed = (undefined4)local_110;
  bmInfo_01.biClrImportant = local_110._4_4_;
  save_components_to_files
            ((TRIPLERGB **)uVar8,bmFile_08,bmInfo_01,1,"file_Y.bmp","file_Cb.bmp","file_Cr.bmp");
  mrxCb = loadBMPFile((BITMAPFILEHEADER *)&bmInfoDef.biClrUsed,(BITMAPINFOHEADER *)&mrxRGB,file_Y);
  mrxCr = loadBMPFile((BITMAPFILEHEADER *)&bmInfoDef.biClrUsed,(BITMAPINFOHEADER *)&mrxRGB,file_Cb);
  mrxRGBconv = loadBMPFile((BITMAPFILEHEADER *)&bmInfoDef.biClrUsed,(BITMAPINFOHEADER *)&mrxRGB,
                           file_Cr);
  local_158._8_8_ = YCbCr2RGB(mrxCb,mrxCr,mrxRGBconv,(int)defWidth,(int)mrxYCbCr);
  local_160 = bmInfoDef.biClrUsed;
  uStack_15c = bmInfoDef.biClrImportant;
  local_158._0_8_ = bmFileDef._0_8_;
  memcpy(&PSNR_RGB_RGBr_red,&mrxRGB,0x28);
  bmFile_07.bfReserved1 = local_158._0_2_;
  bmFile_07.bfReserved2 = local_158._2_2_;
  bmFile_07.bfOffBits = local_158._4_4_;
  bmFile_07._0_8_ = _local_160;
  bmInfo_02.biHeight = (undefined4)uStack_180;
  bmInfo_02.biPlanes = uStack_180._4_2_;
  bmInfo_02.biBitCount = uStack_180._6_2_;
  bmInfo_02._0_8_ = PSNR_RGB_RGBr_red;
  bmInfo_02.biCompression = (undefined4)local_178;
  bmInfo_02.biSizeImage = local_178._4_4_;
  bmInfo_02.biXPelsPerMeter = (undefined4)uStack_170;
  bmInfo_02.biYPelsPerMeter = uStack_170._4_4_;
  bmInfo_02.biClrUsed = (undefined4)local_168;
  bmInfo_02.biClrImportant = local_168._4_4_;
  saveBMPFile(bmFile_07,bmInfo_02,(TRIPLERGB **)local_158._8_8_,file_rgb_recov);
  PSNR_RGB_RGBr_green =
       getPSNR((TRIPLEBYTES **)local_78._8_8_,(TRIPLEBYTES **)local_158._8_8_,0,0,(int)defWidth,
               (int)mrxYCbCr,0);
  PSNR_RGB_RGBr_blue =
       getPSNR((TRIPLEBYTES **)local_78._8_8_,(TRIPLEBYTES **)local_158._8_8_,0,0,(int)defWidth,
               (int)mrxYCbCr,1);
  local_1a8._8_8_ =
       getPSNR((TRIPLEBYTES **)local_78._8_8_,(TRIPLEBYTES **)local_158._8_8_,0,0,(int)defWidth,
               (int)mrxYCbCr,2);
  checkCorrelationProperties((TRIPLERGB **)local_78._8_8_,(int)defWidth,(int)mrxYCbCr,0);
  checkCorrelationProperties((TRIPLERGB **)local_c8._8_8_,(int)defWidth,(int)mrxYCbCr,1);
  std::operator<<((ostream *)&std::cout,"-------------------------------------\n");
  poVar9 = std::operator<<((ostream *)&std::cout,"PSNR(red)[RGB, RGBr] = ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,PSNR_RGB_RGBr_green);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,"PSNR(green)[RGB, RGBr] = ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,PSNR_RGB_RGBr_blue);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,"PSNR(blue)[RGB, RGBr] = ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(double)local_1a8._8_8_);
  std::operator<<(poVar9,"\n");
  std::operator<<((ostream *)&std::cout,"-------------------------------------\n");
  std::operator<<((ostream *)&std::cout,"\nDecimation \"mean\" x2:\n");
  ppTVar7 = mrxCr;
  local_1b0 = bmInfoDef.biClrUsed;
  uStack_1ac = bmInfoDef.biClrImportant;
  local_1a8._0_8_ = bmFileDef._0_8_;
  memcpy(&local_1e0.bfReserved1,&mrxRGB,0x28);
  bmFile_06.bfReserved1 = local_1a8._0_2_;
  bmFile_06.bfReserved2 = local_1a8._2_2_;
  bmFile_06.bfOffBits = local_1a8._4_4_;
  bmFile_06._0_8_ = _local_1b0;
  bmInfo_03.biHeight = (undefined4)uStack_1d0;
  bmInfo_03.biPlanes = uStack_1d0._4_2_;
  bmInfo_03.biBitCount = uStack_1d0._6_2_;
  bmInfo_03._0_8_ = local_1e0._8_8_;
  bmInfo_03.biCompression = (undefined4)local_1c8;
  bmInfo_03.biSizeImage = local_1c8._4_4_;
  bmInfo_03.biXPelsPerMeter = (undefined4)uStack_1c0;
  bmInfo_03.biYPelsPerMeter = uStack_1c0._4_4_;
  bmInfo_03.biClrUsed = (undefined4)local_1b8;
  bmInfo_03.biClrImportant = local_1b8._4_4_;
  decimationAndRecovering
            (ppTVar7,bmFile_06,bmInfo_03,1,2,"images/decMeanCb2.bmp","images/recMeanCb2.bmp");
  ppTVar7 = mrxRGBconv;
  local_1e8 = bmInfoDef.biClrUsed;
  uStack_1e4 = bmInfoDef.biClrImportant;
  local_1e0._0_8_ = bmFileDef._0_8_;
  memcpy(&local_218.bfReserved1,&mrxRGB,0x28);
  bmFile_05.bfReserved1 = local_1e0.bfType;
  bmFile_05.bfReserved2 = local_1e0._2_2_;
  bmFile_05.bfOffBits = local_1e0.bfSize;
  bmFile_05._0_8_ = _local_1e8;
  bmInfo_04.biHeight = (undefined4)uStack_208;
  bmInfo_04.biPlanes = uStack_208._4_2_;
  bmInfo_04.biBitCount = uStack_208._6_2_;
  bmInfo_04._0_8_ = local_218._8_8_;
  bmInfo_04.biCompression = (undefined4)local_200;
  bmInfo_04.biSizeImage = local_200._4_4_;
  bmInfo_04.biXPelsPerMeter = (undefined4)uStack_1f8;
  bmInfo_04.biYPelsPerMeter = uStack_1f8._4_4_;
  bmInfo_04.biClrUsed = (undefined4)local_1f0;
  bmInfo_04.biClrImportant = local_1f0._4_4_;
  decimationAndRecovering
            (ppTVar7,bmFile_05,bmInfo_04,1,2,"images/decMeanCr2.bmp","images/recMeanCr2.bmp");
  check_PSNR_for_recov
            ((TRIPLERGB **)local_78._8_8_,mrxCb,mrxCr,mrxRGBconv,"images/recMeanCb2.bmp",
             "images/recMeanCr2.bmp","images/recoveryMeanRGB2.bmp");
  std::operator<<((ostream *)&std::cout,"\nDecimation \"mean\" x4:\n");
  ppTVar7 = mrxCr;
  local_220 = bmInfoDef.biClrUsed;
  uStack_21c = bmInfoDef.biClrImportant;
  local_218._0_8_ = bmFileDef._0_8_;
  memcpy(&local_250.bfReserved1,&mrxRGB,0x28);
  bmFile_04.bfReserved1 = local_218.bfType;
  bmFile_04.bfReserved2 = local_218._2_2_;
  bmFile_04.bfOffBits = local_218.bfSize;
  bmFile_04._0_8_ = _local_220;
  bmInfo_05.biHeight = (undefined4)uStack_240;
  bmInfo_05.biPlanes = uStack_240._4_2_;
  bmInfo_05.biBitCount = uStack_240._6_2_;
  bmInfo_05._0_8_ = local_250._8_8_;
  bmInfo_05.biCompression = (undefined4)local_238;
  bmInfo_05.biSizeImage = local_238._4_4_;
  bmInfo_05.biXPelsPerMeter = (undefined4)uStack_230;
  bmInfo_05.biYPelsPerMeter = uStack_230._4_4_;
  bmInfo_05.biClrUsed = (undefined4)local_228;
  bmInfo_05.biClrImportant = local_228._4_4_;
  decimationAndRecovering
            (ppTVar7,bmFile_04,bmInfo_05,1,4,"images/decMeanCb4.bmp","images/recMeanCb4.bmp");
  ppTVar7 = mrxRGBconv;
  local_258 = bmInfoDef.biClrUsed;
  uStack_254 = bmInfoDef.biClrImportant;
  local_250._0_8_ = bmFileDef._0_8_;
  memcpy(&local_288.bfReserved1,&mrxRGB,0x28);
  bmFile_03.bfReserved1 = local_250.bfType;
  bmFile_03.bfReserved2 = local_250._2_2_;
  bmFile_03.bfOffBits = local_250.bfSize;
  bmFile_03._0_8_ = _local_258;
  bmInfo_06.biHeight = (undefined4)uStack_278;
  bmInfo_06.biPlanes = uStack_278._4_2_;
  bmInfo_06.biBitCount = uStack_278._6_2_;
  bmInfo_06._0_8_ = local_288._8_8_;
  bmInfo_06.biCompression = (undefined4)local_270;
  bmInfo_06.biSizeImage = local_270._4_4_;
  bmInfo_06.biXPelsPerMeter = (undefined4)uStack_268;
  bmInfo_06.biYPelsPerMeter = uStack_268._4_4_;
  bmInfo_06.biClrUsed = (undefined4)local_260;
  bmInfo_06.biClrImportant = local_260._4_4_;
  decimationAndRecovering
            (ppTVar7,bmFile_03,bmInfo_06,1,4,"images/decMeanCr4.bmp","images/recMeanCr4.bmp");
  check_PSNR_for_recov
            ((TRIPLERGB **)local_78._8_8_,mrxCb,mrxCr,mrxRGBconv,"images/recMeanCb4.bmp",
             "images/recMeanCr4.bmp","images/recoveryMeanRGB4.bmp");
  std::operator<<((ostream *)&std::cout,"\nDecimation \"ejection\" x2:\n");
  ppTVar7 = mrxCr;
  local_290 = bmInfoDef.biClrUsed;
  uStack_28c = bmInfoDef.biClrImportant;
  local_288._0_8_ = bmFileDef._0_8_;
  memcpy(&local_2c0.bfReserved1,&mrxRGB,0x28);
  bmFile_02.bfReserved1 = local_288.bfType;
  bmFile_02.bfReserved2 = local_288._2_2_;
  bmFile_02.bfOffBits = local_288.bfSize;
  bmFile_02._0_8_ = _local_290;
  bmInfo_07.biHeight = (undefined4)uStack_2b0;
  bmInfo_07.biPlanes = uStack_2b0._4_2_;
  bmInfo_07.biBitCount = uStack_2b0._6_2_;
  bmInfo_07._0_8_ = local_2c0._8_8_;
  bmInfo_07.biCompression = (undefined4)local_2a8;
  bmInfo_07.biSizeImage = local_2a8._4_4_;
  bmInfo_07.biXPelsPerMeter = (undefined4)uStack_2a0;
  bmInfo_07.biYPelsPerMeter = uStack_2a0._4_4_;
  bmInfo_07.biClrUsed = (undefined4)local_298;
  bmInfo_07.biClrImportant = local_298._4_4_;
  decimationAndRecovering
            (ppTVar7,bmFile_02,bmInfo_07,0,2,"images/decEjectCb2.bmp","images/recEjectCb2.bmp");
  ppTVar7 = mrxRGBconv;
  local_2c8 = bmInfoDef.biClrUsed;
  uStack_2c4 = bmInfoDef.biClrImportant;
  local_2c0._0_8_ = bmFileDef._0_8_;
  memcpy(&local_2f8.bfReserved1,&mrxRGB,0x28);
  bmFile_01.bfReserved1 = local_2c0.bfType;
  bmFile_01.bfReserved2 = local_2c0._2_2_;
  bmFile_01.bfOffBits = local_2c0.bfSize;
  bmFile_01._0_8_ = _local_2c8;
  bmInfo_08.biHeight = (undefined4)uStack_2e8;
  bmInfo_08.biPlanes = uStack_2e8._4_2_;
  bmInfo_08.biBitCount = uStack_2e8._6_2_;
  bmInfo_08._0_8_ = local_2f8._8_8_;
  bmInfo_08.biCompression = (undefined4)local_2e0;
  bmInfo_08.biSizeImage = local_2e0._4_4_;
  bmInfo_08.biXPelsPerMeter = (undefined4)uStack_2d8;
  bmInfo_08.biYPelsPerMeter = uStack_2d8._4_4_;
  bmInfo_08.biClrUsed = (undefined4)local_2d0;
  bmInfo_08.biClrImportant = local_2d0._4_4_;
  decimationAndRecovering
            (ppTVar7,bmFile_01,bmInfo_08,0,2,"images/decEjectCr2.bmp","images/recEjectCr2.bmp");
  check_PSNR_for_recov
            ((TRIPLERGB **)local_78._8_8_,mrxCb,mrxCr,mrxRGBconv,"images/recEjectCb2.bmp",
             "images/recEjectCr2.bmp","images/recoveryEjectRGB2.bmp");
  std::operator<<((ostream *)&std::cout,"\nDecimation \"ejection\" x4:\n");
  ppTVar7 = mrxCr;
  local_300 = bmInfoDef.biClrUsed;
  uStack_2fc = bmInfoDef.biClrImportant;
  local_2f8._0_8_ = bmFileDef._0_8_;
  memcpy(&local_330.bfReserved1,&mrxRGB,0x28);
  bmFile_00.bfReserved1 = local_2f8.bfType;
  bmFile_00.bfReserved2 = local_2f8._2_2_;
  bmFile_00.bfOffBits = local_2f8.bfSize;
  bmFile_00._0_8_ = _local_300;
  bmInfo_09.biHeight = (undefined4)uStack_320;
  bmInfo_09.biPlanes = uStack_320._4_2_;
  bmInfo_09.biBitCount = uStack_320._6_2_;
  bmInfo_09._0_8_ = local_330._8_8_;
  bmInfo_09.biCompression = (undefined4)local_318;
  bmInfo_09.biSizeImage = local_318._4_4_;
  bmInfo_09.biXPelsPerMeter = (undefined4)uStack_310;
  bmInfo_09.biYPelsPerMeter = uStack_310._4_4_;
  bmInfo_09.biClrUsed = (undefined4)local_308;
  bmInfo_09.biClrImportant = local_308._4_4_;
  decimationAndRecovering
            (ppTVar7,bmFile_00,bmInfo_09,0,4,"images/decEjectCb4.bmp","images/recEjectCb4.bmp");
  ppTVar7 = mrxRGBconv;
  local_338 = bmInfoDef.biClrUsed;
  uStack_334 = bmInfoDef.biClrImportant;
  local_330._0_8_ = bmFileDef._0_8_;
  memcpy(&freq,&mrxRGB,0x28);
  bmFile.bfReserved1 = local_330.bfType;
  bmFile.bfReserved2 = local_330._2_2_;
  bmFile.bfOffBits = local_330.bfSize;
  bmFile._0_8_ = _local_338;
  bmInfo_10.biHeight = (undefined4)uStack_358;
  bmInfo_10.biPlanes = uStack_358._4_2_;
  bmInfo_10.biBitCount = uStack_358._6_2_;
  bmInfo_10._0_8_ = freq;
  bmInfo_10.biCompression = (undefined4)local_350;
  bmInfo_10.biSizeImage = local_350._4_4_;
  bmInfo_10.biXPelsPerMeter = (undefined4)uStack_348;
  bmInfo_10.biYPelsPerMeter = uStack_348._4_4_;
  bmInfo_10.biClrUsed = (undefined4)local_340;
  bmInfo_10.biClrImportant = local_340._4_4_;
  decimationAndRecovering
            (ppTVar7,bmFile,bmInfo_10,0,4,"images/decEjectCr4.bmp","images/recEjectCr4.bmp");
  check_PSNR_for_recov
            ((TRIPLERGB **)local_78._8_8_,mrxCb,mrxCr,mrxRGBconv,"images/recEjectCb4.bmp",
             "images/recEjectCr4.bmp","images/recoveryEjectRGB4.bmp");
  std::operator<<((ostream *)&std::cout,"-------------------------------------\n");
  piVar10 = getHistFreqFromTriple
                      ((TRIPLERGB **)local_78._8_8_,(int)defWidth,(int)mrxYCbCr,0,
                       "histograms/Part1/histRed/","histRed.csv");
  dVar1 = getEntropy(piVar10,(int)defWidth * (int)mrxYCbCr);
  if (piVar10 != (int *)0x0) {
    operator_delete__(piVar10);
  }
  piVar10 = getHistFreqFromTriple
                      ((TRIPLERGB **)local_78._8_8_,(int)defWidth,(int)mrxYCbCr,1,
                       "histograms/Part1/histGreen/","histGreen.csv");
  dVar2 = getEntropy(piVar10,(int)defWidth * (int)mrxYCbCr);
  if (piVar10 != (int *)0x0) {
    operator_delete__(piVar10);
  }
  piVar10 = getHistFreqFromTriple
                      ((TRIPLERGB **)local_78._8_8_,(int)defWidth,(int)mrxYCbCr,2,
                       "histograms/Part1/histBlue/","histBlue.csv");
  dVar3 = getEntropy(piVar10,(int)defWidth * (int)mrxYCbCr);
  if (piVar10 != (int *)0x0) {
    operator_delete__(piVar10);
  }
  piVar10 = getHistFreqFromTriple
                      ((TRIPLERGB **)local_c8._8_8_,(int)defWidth,(int)mrxYCbCr,0,
                       "histograms/Part1/histY/","histY.csv");
  dVar4 = getEntropy(piVar10,(int)defWidth * (int)mrxYCbCr);
  if (piVar10 != (int *)0x0) {
    operator_delete__(piVar10);
  }
  piVar10 = getHistFreqFromTriple
                      ((TRIPLERGB **)local_c8._8_8_,(int)defWidth,(int)mrxYCbCr,1,
                       "histograms/Part1/histCb/","histCb.csv");
  dVar5 = getEntropy(piVar10,(int)defWidth * (int)mrxYCbCr);
  if (piVar10 != (int *)0x0) {
    operator_delete__(piVar10);
  }
  piVar10 = getHistFreqFromTriple
                      ((TRIPLERGB **)local_c8._8_8_,(int)defWidth,(int)mrxYCbCr,2,
                       "histograms/Part1/histCr/","histCr.csv");
  dVar6 = getEntropy(piVar10,(int)defWidth * (int)mrxYCbCr);
  if (piVar10 != (int *)0x0) {
    operator_delete__(piVar10);
  }
  poVar9 = std::operator<<((ostream *)&std::cout,"Entropy_Red = ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar1);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,"Entropy_Green = ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar2);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,"Entropy_Blue = ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar3);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,"Entropy_Y = ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar4);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,"Entropy_Cb = ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar5);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,"Entropy_Cr = ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
  std::operator<<(poVar9,"\n");
  printf("-------------------------------------\n");
  printf("-------------------------------------\n");
  printf("-------------------------------------\n");
  usleep(2000000);
  for (local_39c = 0; (ulong)(long)local_39c < defWidth; local_39c = local_39c + 1) {
    if (*(TRIPLEBYTES **)(local_78._8_8_ + (long)local_39c * 8) != (TRIPLEBYTES *)0x0) {
      operator_delete__(*(TRIPLEBYTES **)(local_78._8_8_ + (long)local_39c * 8));
    }
    if (*(TRIPLEYCbCr **)(local_c8._8_8_ + (long)local_39c * 8) != (TRIPLEYCbCr *)0x0) {
      operator_delete__(*(TRIPLEYCbCr **)(local_c8._8_8_ + (long)local_39c * 8));
    }
    if (mrxCb[local_39c] != (TRIPLERGB *)0x0) {
      operator_delete__(mrxCb[local_39c]);
    }
    if (mrxCr[local_39c] != (TRIPLERGB *)0x0) {
      operator_delete__(mrxCr[local_39c]);
    }
    if (mrxRGBconv[local_39c] != (TRIPLERGB *)0x0) {
      operator_delete__(mrxRGBconv[local_39c]);
    }
    if (*(TRIPLEBYTES **)(local_158._8_8_ + (long)local_39c * 8) != (TRIPLEBYTES *)0x0) {
      operator_delete__(*(TRIPLEBYTES **)(local_158._8_8_ + (long)local_39c * 8));
    }
  }
  if ((TRIPLEBYTES **)local_78._8_8_ != (TRIPLEBYTES **)0x0) {
    operator_delete__((void *)local_78._8_8_);
  }
  if ((TRIPLEYCbCr **)local_c8._8_8_ != (TRIPLEYCbCr **)0x0) {
    operator_delete__((void *)local_c8._8_8_);
  }
  if (mrxCb != (TRIPLERGB **)0x0) {
    operator_delete__(mrxCb);
  }
  if (mrxCr != (TRIPLERGB **)0x0) {
    operator_delete__(mrxCr);
  }
  if (mrxRGBconv != (TRIPLERGB **)0x0) {
    operator_delete__(mrxRGBconv);
  }
  if ((TRIPLEBYTES **)local_158._8_8_ != (TRIPLEBYTES **)0x0) {
    operator_delete__((void *)local_158._8_8_);
  }
  return;
}

Assistant:

void example1(const char *filename, const char *file_Y, const char *file_Cb, const char *file_Cr,
              const char *file_rgb_recov) {
    BITMAPFILEHEADER bmFileDef;
    BITMAPINFOHEADER bmInfoDef;
    std::cout << "reading file...\n";
    system("mkdir -p images");
    system("mkdir -p histograms");
    //Read bmp file
    TRIPLERGB **mrxRGB = loadBMPFile(&bmFileDef, &bmInfoDef, filename);
    std::cout << "-------------------------------------\n";
    printHeader(bmFileDef, bmInfoDef);
    std::cout << "-------------------------------------\n";
    size_t defHeight = bmInfoDef.biHeight;
    size_t defWidth = bmInfoDef.biWidth;
    TRIPLERGB **mrxYCbCr = (TRIPLERGB **) RGB2YCbCr(mrxRGB, defHeight, defWidth);

    save_components_to_files(mrxRGB, bmFileDef, bmInfoDef, FORMAT_RGB,
                             "file_Red.bmp", "file_Green.bmp", "file_Blue.bmp");
    save_components_to_files(mrxYCbCr, bmFileDef, bmInfoDef, FORMAT_YCBCR,
                             "file_Y.bmp", "file_Cb.bmp", "file_Cr.bmp");

    TRIPLERGB **mrxY = loadBMPFile(&bmFileDef, &bmInfoDef, file_Y);
    TRIPLERGB **mrxCb = loadBMPFile(&bmFileDef, &bmInfoDef, file_Cb);
    TRIPLERGB **mrxCr = loadBMPFile(&bmFileDef, &bmInfoDef, file_Cr);
    TRIPLERGB **mrxRGBconv = YCbCr2RGB(mrxY, mrxCb, mrxCr, defHeight, defWidth);
    saveBMPFile(bmFileDef, bmInfoDef, mrxRGBconv, file_rgb_recov);

    double PSNR_RGB_RGBr_red = getPSNR((TRIPLEBYTES **) mrxRGB, (TRIPLEBYTES **) mrxRGBconv, 0, 0, defHeight, defWidth,
                                       COMPONENT_RED);
    double PSNR_RGB_RGBr_green = getPSNR((TRIPLEBYTES **) mrxRGB, (TRIPLEBYTES **) mrxRGBconv, 0, 0, defHeight,
                                         defWidth, COMPONENT_GREEN);
    double PSNR_RGB_RGBr_blue = getPSNR((TRIPLEBYTES **) mrxRGB, (TRIPLEBYTES **) mrxRGBconv, 0, 0, defHeight, defWidth,
                                        COMPONENT_BLUE);
    checkCorrelationProperties(mrxRGB, defHeight, defWidth, FORMAT_RGB);
    checkCorrelationProperties(mrxYCbCr, defHeight, defWidth, FORMAT_YCBCR);
    std::cout << "-------------------------------------\n";
    std::cout << "PSNR(red)[RGB, RGBr] = " << PSNR_RGB_RGBr_red << "\n";
    std::cout << "PSNR(green)[RGB, RGBr] = " << PSNR_RGB_RGBr_green << "\n";
    std::cout << "PSNR(blue)[RGB, RGBr] = " << PSNR_RGB_RGBr_blue << "\n";


    std::cout << "-------------------------------------\n";
    std::cout << "\nDecimation \"mean\" x2:\n";
    decimationAndRecovering(mrxCb, bmFileDef, bmInfoDef, DECIMATION_MEAN, 2,
                            "images/decMeanCb2.bmp", "images/recMeanCb2.bmp");
    decimationAndRecovering(mrxCr, bmFileDef, bmInfoDef, DECIMATION_MEAN, 2,
                            "images/decMeanCr2.bmp", "images/recMeanCr2.bmp");
    check_PSNR_for_recov(mrxRGB, mrxY, mrxCb, mrxCr, "images/recMeanCb2.bmp", "images/recMeanCr2.bmp",
                         "images/recoveryMeanRGB2.bmp");
    std::cout << "\nDecimation \"mean\" x4:\n";
    decimationAndRecovering(mrxCb, bmFileDef, bmInfoDef, DECIMATION_MEAN, 4,
                            "images/decMeanCb4.bmp", "images/recMeanCb4.bmp");
    decimationAndRecovering(mrxCr, bmFileDef, bmInfoDef, DECIMATION_MEAN, 4,
                            "images/decMeanCr4.bmp", "images/recMeanCr4.bmp");

    check_PSNR_for_recov(mrxRGB, mrxY, mrxCb, mrxCr, "images/recMeanCb4.bmp", "images/recMeanCr4.bmp",
                         "images/recoveryMeanRGB4.bmp");

    std::cout << "\nDecimation \"ejection\" x2:\n";
    decimationAndRecovering(mrxCb, bmFileDef, bmInfoDef, DECIMATION_EJECT, 2,
                            "images/decEjectCb2.bmp", "images/recEjectCb2.bmp");
    decimationAndRecovering(mrxCr, bmFileDef, bmInfoDef, DECIMATION_EJECT, 2,
                            "images/decEjectCr2.bmp", "images/recEjectCr2.bmp");
    check_PSNR_for_recov(mrxRGB, mrxY, mrxCb, mrxCr, "images/recEjectCb2.bmp", "images/recEjectCr2.bmp",
                         "images/recoveryEjectRGB2.bmp");
    std::cout << "\nDecimation \"ejection\" x4:\n";
    decimationAndRecovering(mrxCb, bmFileDef, bmInfoDef, DECIMATION_EJECT, 4,
                            "images/decEjectCb4.bmp", "images/recEjectCb4.bmp");
    decimationAndRecovering(mrxCr, bmFileDef, bmInfoDef, DECIMATION_EJECT, 4,
                            "images/decEjectCr4.bmp", "images/recEjectCr4.bmp");

    check_PSNR_for_recov(mrxRGB, mrxY, mrxCb, mrxCr, "images/recEjectCb4.bmp", "images/recEjectCr4.bmp",
                         "images/recoveryEjectRGB4.bmp");
    std::cout << "-------------------------------------\n";

    int *freq;
    freq = getHistFreqFromTriple(mrxRGB, defHeight, defWidth, COMPONENT_RED, "histograms/Part1/histRed/",
                                 "histRed.csv");
    double entropyRed = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxRGB, defHeight, defWidth, COMPONENT_GREEN, "histograms/Part1/histGreen/",
                                 "histGreen.csv");
    double entropyGreen = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxRGB, defHeight, defWidth, COMPONENT_BLUE, "histograms/Part1/histBlue/",
                                 "histBlue.csv");
    double entropyBlue = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxYCbCr, defHeight, defWidth, COMPONENT_RED, "histograms/Part1/histY/", "histY.csv");
    double entropyY = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxYCbCr, defHeight, defWidth, COMPONENT_GREEN, "histograms/Part1/histCb/",
                                 "histCb.csv");
    double entropyCb = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxYCbCr, defHeight, defWidth, COMPONENT_BLUE, "histograms/Part1/histCr/",
                                 "histCr.csv");
    double entropyCr = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    std::cout << "Entropy_Red = " << entropyRed << "\n";
    std::cout << "Entropy_Green = " << entropyGreen << "\n";
    std::cout << "Entropy_Blue = " << entropyBlue << "\n";
    std::cout << "Entropy_Y = " << entropyY << "\n";
    std::cout << "Entropy_Cb = " << entropyCb << "\n";
    std::cout << "Entropy_Cr = " << entropyCr << "\n";
    printf("-------------------------------------\n");
    printf("-------------------------------------\n");
    printf("-------------------------------------\n");
    usleep(2 * 1000 * 1000);
    //system("csv_charts -h histograms/Part1/histRed/ & exit");
    //system("csv_charts -h histograms/Part1/histGreen/ & exit");
    //system("csv_charts -h histograms/Part1/histBlue/ & exit");
    //system("csv_charts -h histograms/Part1/histY/ & exit");
    //system("csv_charts -h histograms/Part1/histCb/ & exit");
    //system("csv_charts -h histograms/Part1/histCr/ & exit");
    for (int i = 0; i < defHeight; i++) {
        delete[] mrxRGB[i];
        delete[] mrxYCbCr[i];
        delete[] mrxY[i];
        delete[] mrxCb[i];
        delete[] mrxCr[i];
        delete[] mrxRGBconv[i];
    }
    delete[] mrxRGB;
    delete[] mrxYCbCr;
    delete[] mrxY;
    delete[] mrxCb;
    delete[] mrxCr;
    delete[] mrxRGBconv;
}